

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quaternion.h
# Opt level: O0

void Eigen::internal::quaternionbase_assign_impl<Eigen::Matrix<float,3,3,0,3,3>,3,3>::
     run<Eigen::Quaternion<float,0>>
               (QuaternionBase<Eigen::Quaternion<float,_0>_> *q,Matrix<float,_3,_3,_0,_3,_3> *a_mat)

{
  float fVar1;
  float fVar2;
  NonConstCoeffReturnType pfVar3;
  Scalar *pSVar4;
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *pPVar5;
  Scalar *pSVar6;
  ulong rowId;
  ulong rowId_00;
  Scalar SVar7;
  float fVar8;
  double dVar9;
  Index k;
  Index j;
  Index i;
  Scalar t;
  type mat;
  Matrix<float,_3,_3,_0,_3,_3> *a_mat_local;
  QuaternionBase<Eigen::Quaternion<float,_0>_> *q_local;
  
  SVar7 = MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::trace
                    ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)a_mat);
  if (SVar7 <= 0.0) {
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,1,1);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,0,0);
    j = (Index)(*pSVar4 <= fVar1 && fVar1 != *pSVar4);
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,2,2);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,j,j);
    if (*pSVar4 <= fVar1 && fVar1 != *pSVar4) {
      j = 2;
    }
    rowId = (j + 1U) % 3;
    rowId_00 = (rowId + 1) % 3;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,j,j);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId,
                        rowId);
    fVar2 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId_00
                        ,rowId_00);
    dVar9 = std::sqrt((double)(ulong)(uint)(((fVar1 - fVar2) - *pSVar4) + 1.0));
    pPVar5 = &QuaternionBase<Eigen::Quaternion<float,_0>_>::coeffs(q)->
              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
    pSVar6 = PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::coeffRef(pPVar5,j);
    *pSVar6 = SUB84(dVar9,0) * 0.5;
    fVar8 = 0.5 / SUB84(dVar9,0);
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId_00
                        ,rowId);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId,
                        rowId_00);
    fVar2 = *pSVar4;
    pfVar3 = QuaternionBase<Eigen::Quaternion<float,_0>_>::w(q);
    *pfVar3 = (fVar1 - fVar2) * fVar8;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId,j)
    ;
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,j,rowId)
    ;
    fVar2 = *pSVar4;
    pPVar5 = &QuaternionBase<Eigen::Quaternion<float,_0>_>::coeffs(q)->
              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
    pSVar6 = PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::coeffRef(pPVar5,rowId);
    *pSVar6 = (fVar1 + fVar2) * fVar8;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,rowId_00
                        ,j);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,j,
                        rowId_00);
    fVar2 = *pSVar4;
    pPVar5 = &QuaternionBase<Eigen::Quaternion<float,_0>_>::coeffs(q)->
              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>;
    pSVar6 = PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::coeffRef(pPVar5,rowId_00);
    *pSVar6 = (fVar1 + fVar2) * fVar8;
  }
  else {
    dVar9 = std::sqrt((double)(ulong)(uint)(SVar7 + 1.0));
    pfVar3 = QuaternionBase<Eigen::Quaternion<float,_0>_>::w(q);
    *pfVar3 = SUB84(dVar9,0) * 0.5;
    fVar8 = 0.5 / SUB84(dVar9,0);
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,2,1);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,1,2);
    fVar2 = *pSVar4;
    pfVar3 = QuaternionBase<Eigen::Quaternion<float,_0>_>::x(q);
    *pfVar3 = (fVar1 - fVar2) * fVar8;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,0,2);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,2,0);
    fVar2 = *pSVar4;
    pfVar3 = QuaternionBase<Eigen::Quaternion<float,_0>_>::y(q);
    *pfVar3 = (fVar1 - fVar2) * fVar8;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,1,0);
    fVar1 = *pSVar4;
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::coeff
                       (&a_mat->super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>,0,1);
    fVar2 = *pSVar4;
    pfVar3 = QuaternionBase<Eigen::Quaternion<float,_0>_>::z(q);
    *pfVar3 = (fVar1 - fVar2) * fVar8;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC static inline void run(QuaternionBase<Derived>& q, const Other& a_mat)
  {
    const typename internal::nested_eval<Other,2>::type mat(a_mat);
    EIGEN_USING_STD(sqrt)
    // This algorithm comes from  "Quaternion Calculus and Fast Animation",
    // Ken Shoemake, 1987 SIGGRAPH course notes
    Scalar t = mat.trace();
    if (t > Scalar(0))
    {
      t = sqrt(t + Scalar(1.0));
      q.w() = Scalar(0.5)*t;
      t = Scalar(0.5)/t;
      q.x() = (mat.coeff(2,1) - mat.coeff(1,2)) * t;
      q.y() = (mat.coeff(0,2) - mat.coeff(2,0)) * t;
      q.z() = (mat.coeff(1,0) - mat.coeff(0,1)) * t;
    }
    else
    {
      Index i = 0;
      if (mat.coeff(1,1) > mat.coeff(0,0))
        i = 1;
      if (mat.coeff(2,2) > mat.coeff(i,i))
        i = 2;
      Index j = (i+1)%3;
      Index k = (j+1)%3;

      t = sqrt(mat.coeff(i,i)-mat.coeff(j,j)-mat.coeff(k,k) + Scalar(1.0));
      q.coeffs().coeffRef(i) = Scalar(0.5) * t;
      t = Scalar(0.5)/t;
      q.w() = (mat.coeff(k,j)-mat.coeff(j,k))*t;
      q.coeffs().coeffRef(j) = (mat.coeff(j,i)+mat.coeff(i,j))*t;
      q.coeffs().coeffRef(k) = (mat.coeff(k,i)+mat.coeff(i,k))*t;
    }
  }